

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mri_tables.c
# Opt level: O0

int mriStepCoupling_GetStageMap(MRIStepCoupling MRIC,int *stage_map,int *nstages_active)

{
  sunrealtype tol;
  sunrealtype Gsum;
  sunrealtype Wsum;
  int idx;
  int k;
  int j;
  int i;
  int *nstages_active_local;
  int *stage_map_local;
  MRIStepCoupling MRIC_local;
  int local_4;
  
  if (MRIC == (MRIStepCoupling)0x0) {
    local_4 = -0x16;
  }
  else if ((MRIC->W == (sunrealtype ***)0x0) && (MRIC->G == (sunrealtype ***)0x0)) {
    local_4 = -0x16;
  }
  else if ((stage_map == (int *)0x0) || (nstages_active == (int *)0x0)) {
    local_4 = -0x16;
  }
  else {
    *nstages_active = 0;
    idx = 0;
    for (j = 0; j < MRIC->stages; j = j + 1) {
      Wsum = 0.0;
      Gsum = 0.0;
      if (MRIC->W != (sunrealtype ***)0x0) {
        for (k = 0; k < MRIC->nmat; k = k + 1) {
          for (i = 0; i < MRIC->stages; i = i + 1) {
            Wsum = ABS(MRIC->W[k][i][j]) + Wsum;
          }
        }
      }
      if (MRIC->G != (sunrealtype ***)0x0) {
        for (k = 0; k < MRIC->nmat; k = k + 1) {
          for (i = 0; i < MRIC->stages; i = i + 1) {
            Gsum = ABS(MRIC->G[k][i][j]) + Gsum;
          }
        }
      }
      if ((2.220446049250313e-14 < Wsum) || (2.220446049250313e-14 < Gsum)) {
        stage_map[j] = idx;
        idx = idx + 1;
      }
      else {
        stage_map[j] = -1;
      }
    }
    if (idx < 1) {
      local_4 = -0x16;
    }
    else {
      *nstages_active = idx;
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int mriStepCoupling_GetStageMap(MRIStepCoupling MRIC, int* stage_map,
                                int* nstages_active)
{
  int i, j, k, idx;
  sunrealtype Wsum, Gsum;
  const sunrealtype tol = SUN_RCONST(100.0) * SUN_UNIT_ROUNDOFF;

  /* ----------------------
   * Check for valid inputs
   * ---------------------- */

  if (!MRIC) { return (ARK_ILL_INPUT); }
  if (!(MRIC->W) && !(MRIC->G)) { return (ARK_ILL_INPUT); }
  if (!stage_map || !nstages_active) { return (ARK_ILL_INPUT); }

  /* -------------------
   * Compute storage map
   * ------------------- */

  /* Number of stage RHS vectors active */
  *nstages_active = 0;

  /* Initial storage index */
  idx = 0;

  /* Check if a stage corresponds to a column of zeros for all coupling
   * matrices by computing the column sums */
  for (j = 0; j < MRIC->stages; j++)
  {
    Wsum = ZERO;
    Gsum = ZERO;

    if (MRIC->W)
    {
      for (k = 0; k < MRIC->nmat; k++)
      {
        for (i = 0; i < MRIC->stages; i++)
        {
          Wsum += SUNRabs(MRIC->W[k][i][j]);
        }
      }
    }

    if (MRIC->G)
    {
      for (k = 0; k < MRIC->nmat; k++)
      {
        for (i = 0; i < MRIC->stages; i++)
        {
          Gsum += SUNRabs(MRIC->G[k][i][j]);
        }
      }
    }

    if (Wsum > tol || Gsum > tol)
    {
      stage_map[j] = idx;
      idx++;
    }
    else { stage_map[j] = -1; }
  }

  /* Check and set number of stage RHS vectors active */
  if (idx < 1) { return (ARK_ILL_INPUT); }

  *nstages_active = idx;

  return (ARK_SUCCESS);
}